

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void jpgd::Row<2>::idct(int *pTemp,jpgd_block_t *pSrc)

{
  ushort uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  
  uVar1 = pSrc[1];
  uVar2 = (int)*pSrc << 0xd | 0x400;
  auVar3._2_2_ = 0;
  auVar3._0_2_ = uVar1;
  auVar3._4_2_ = uVar1;
  auVar3._6_2_ = 0;
  auVar3._8_2_ = uVar1;
  auVar3._10_2_ = 0;
  auVar3._12_2_ = uVar1;
  auVar3._14_2_ = 0;
  auVar3 = pmaddwd(auVar3,_DAT_00116530);
  pTemp[4] = (int)(uVar2 - auVar3._12_4_) >> 0xb;
  pTemp[5] = (int)(uVar2 - auVar3._8_4_) >> 0xb;
  pTemp[6] = (int)(uVar2 - auVar3._4_4_) >> 0xb;
  pTemp[7] = (int)(uVar2 - auVar3._0_4_) >> 0xb;
  *pTemp = (int)(auVar3._0_4_ + uVar2) >> 0xb;
  pTemp[1] = (int)(auVar3._4_4_ + uVar2) >> 0xb;
  pTemp[2] = (int)(auVar3._8_4_ + uVar2) >> 0xb;
  pTemp[3] = (int)(auVar3._12_4_ + uVar2) >> 0xb;
  return;
}

Assistant:

static void idct(int* pTemp, const jpgd_block_t* pSrc)
  {
    // ACCESS_COL() will be optimized at compile time to either an array access, or 0.
    #define ACCESS_COL(x) (((x) < NONZERO_COLS) ? (int)pSrc[x] : 0)

    const int z2 = ACCESS_COL(2), z3 = ACCESS_COL(6);

    const int z1 = MULTIPLY(z2 + z3, FIX_0_541196100);
    const int tmp2 = z1 + MULTIPLY(z3, - FIX_1_847759065);
    const int tmp3 = z1 + MULTIPLY(z2, FIX_0_765366865);

    const int tmp0 = (ACCESS_COL(0) + ACCESS_COL(4)) << CONST_BITS;
    const int tmp1 = (ACCESS_COL(0) - ACCESS_COL(4)) << CONST_BITS;

    const int tmp10 = tmp0 + tmp3, tmp13 = tmp0 - tmp3, tmp11 = tmp1 + tmp2, tmp12 = tmp1 - tmp2;

    const int atmp0 = ACCESS_COL(7), atmp1 = ACCESS_COL(5), atmp2 = ACCESS_COL(3), atmp3 = ACCESS_COL(1);

    const int bz1 = atmp0 + atmp3, bz2 = atmp1 + atmp2, bz3 = atmp0 + atmp2, bz4 = atmp1 + atmp3;
    const int bz5 = MULTIPLY(bz3 + bz4, FIX_1_175875602);

    const int az1 = MULTIPLY(bz1, - FIX_0_899976223);
    const int az2 = MULTIPLY(bz2, - FIX_2_562915447);
    const int az3 = MULTIPLY(bz3, - FIX_1_961570560) + bz5;
    const int az4 = MULTIPLY(bz4, - FIX_0_390180644) + bz5;

    const int btmp0 = MULTIPLY(atmp0, FIX_0_298631336) + az1 + az3;
    const int btmp1 = MULTIPLY(atmp1, FIX_2_053119869) + az2 + az4;
    const int btmp2 = MULTIPLY(atmp2, FIX_3_072711026) + az2 + az3;
    const int btmp3 = MULTIPLY(atmp3, FIX_1_501321110) + az1 + az4;

    pTemp[0] = DESCALE(tmp10 + btmp3, CONST_BITS-PASS1_BITS);
    pTemp[7] = DESCALE(tmp10 - btmp3, CONST_BITS-PASS1_BITS);
    pTemp[1] = DESCALE(tmp11 + btmp2, CONST_BITS-PASS1_BITS);
    pTemp[6] = DESCALE(tmp11 - btmp2, CONST_BITS-PASS1_BITS);
    pTemp[2] = DESCALE(tmp12 + btmp1, CONST_BITS-PASS1_BITS);
    pTemp[5] = DESCALE(tmp12 - btmp1, CONST_BITS-PASS1_BITS);
    pTemp[3] = DESCALE(tmp13 + btmp0, CONST_BITS-PASS1_BITS);
    pTemp[4] = DESCALE(tmp13 - btmp0, CONST_BITS-PASS1_BITS);
  }